

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderInvarianceTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::InvarianceTest::checkImage
          (InvarianceTest *this,Surface *surface)

{
  ostringstream *poVar1;
  void *pvVar2;
  TestLog *pTVar3;
  Surface *surface_00;
  int iVar4;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar5;
  int iVar6;
  _Alloc_hider _Var7;
  Surface errorMask;
  IVec4 okColor;
  string local_368;
  string local_348;
  string local_328;
  Surface local_308;
  string local_2f0;
  LogImageSet local_2d0;
  string local_290;
  string local_270;
  IVec4 local_250;
  LogImage local_240;
  undefined1 local_1b0 [32];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_250.m_data[0] = 0;
  local_250.m_data[1] = 0xff;
  local_250.m_data[2] = 0;
  local_250.m_data[3] = 0xff;
  tcu::Surface::Surface(&local_308,this->m_renderSize,this->m_renderSize);
  local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
  if ((void *)local_308.m_pixels.m_cap != (void *)0x0) {
    local_308.m_pixels.m_cap = (size_t)local_308.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_240,local_308.m_width,
             local_308.m_height,1,(void *)local_308.m_pixels.m_cap);
  tcu::clear((PixelBufferAccess *)local_1b0,&local_250);
  iVar5 = 0;
  iVar6 = iVar5;
  if (0 < this->m_renderSize) {
    pvVar2 = (surface->m_pixels).m_ptr;
    iVar6 = 0;
    do {
      if (0 < this->m_renderSize) {
        iVar4 = 0;
        do {
          if (*(char *)((long)pvVar2 + (long)(surface->m_width * iVar5 + iVar4) * 4) != '\0') {
            *(undefined4 *)
             ((long)local_308.m_pixels.m_ptr + (long)(local_308.m_width * iVar5 + iVar4) * 4) =
                 0xff0000ff;
            iVar6 = 1;
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < this->m_renderSize);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->m_renderSize);
  }
  if (iVar6 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"No variance found.",0x12);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_2d0.m_name._M_dataplus._M_p = (pointer)&local_2d0.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Results","");
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Result verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_2d0.m_name,&local_328);
    tcu::TestLog::startImageSet
              (pTVar3,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Result","");
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Result","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_348,&local_368,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar3,__buf_01,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    _Var7._M_p = local_2d0.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p == &local_2d0.m_name.field_2) goto LAB_003d76f9;
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid pixels found (fragments from first render pass found). Variance detected.",
               0x51);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Results","");
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Result verification","");
    tcu::LogImageSet::LogImageSet(&local_2d0,&local_328,&local_348);
    tcu::TestLog::startImageSet
              (pTVar3,local_2d0.m_name._M_dataplus._M_p,local_2d0.m_description._M_dataplus._M_p);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Result","");
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Result","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_368,&local_2f0,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,(int)pTVar3,__buf,(size_t)surface);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Error mask","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Error mask","");
    surface_00 = &local_308;
    tcu::LogImage::LogImage
              (&local_240,&local_270,&local_290,surface_00,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,(int)pTVar3,__buf_00,(size_t)surface_00);
    tcu::TestLog::endImageSet(pTVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    local_2d0.m_name.field_2._M_allocated_capacity = local_328.field_2._M_allocated_capacity;
    _Var7._M_p = local_328._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p == &local_328.field_2) goto LAB_003d76f9;
  }
  operator_delete(_Var7._M_p,local_2d0.m_name.field_2._M_allocated_capacity + 1);
LAB_003d76f9:
  tcu::Surface::~Surface(&local_308);
  return (bool)(~(byte)iVar6 & 1);
}

Assistant:

bool InvarianceTest::checkImage (const tcu::Surface& surface) const
{
	const tcu::IVec4	okColor		= tcu::IVec4(0, 255, 0, 255);
	const tcu::RGBA		errColor	= tcu::RGBA(255, 0, 0, 255);
	bool				error		= false;
	tcu::Surface		errorMask	(m_renderSize, m_renderSize);

	tcu::clear(errorMask.getAccess(), okColor);

	for (int y = 0; y < m_renderSize; ++y)
	for (int x = 0; x < m_renderSize; ++x)
	{
		const tcu::RGBA col = surface.getPixel(x, y);

		if (col.getRed() != 0)
		{
			errorMask.setPixel(x, y, errColor);
			error = true;
		}
	}

	// report error
	if (error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixels found (fragments from first render pass found). Variance detected." << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result",		"Result",		surface)
			<< tcu::TestLog::Image("Error mask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "No variance found." << tcu::TestLog::EndMessage;
		m_testCtx.getLog()
			<< tcu::TestLog::ImageSet("Results", "Result verification")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}